

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

void computed_property_free(gravity_class_t *c,char *name,_Bool remove_flag)

{
  gravity_closure_t *closure;
  gravity_closure_t *pgVar1;
  gravity_function_t *pgVar2;
  gravity_class_t *pgVar3;
  size_t sVar4;
  gravity_closure_t *closure_00;
  gravity_closure_t *closure_01;
  gravity_value_t key;
  gravity_value_t key_00;
  gravity_class_t *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  char *local_48;
  uint32_t local_40;
  uint32_t local_3c;
  undefined4 local_38;
  
  local_78 = gravity_class_string;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  local_48 = name;
  sVar4 = strlen(name);
  local_3c = (uint32_t)sVar4;
  local_38 = 0;
  local_40 = gravity_hash_compute_buffer(name,local_3c);
  pgVar3 = gravity_class_string;
  key.field_1.p = (gravity_object_t *)&local_78;
  key.isa = gravity_class_string;
  closure_00 = gravity_class_lookup_closure(c,key);
  if (closure_00 != (gravity_closure_t *)0x0) {
    closure = (gravity_closure_t *)(closure_00->f->field_9).field_2.special[0];
    pgVar1 = (gravity_closure_t *)(closure_00->f->field_9).field_2.special[1];
    closure_01 = (gravity_closure_t *)0x0;
    if (closure != pgVar1) {
      closure_01 = pgVar1;
    }
    if (closure != (gravity_closure_t *)0x0) {
      pgVar2 = closure->f;
      gravity_closure_free((gravity_vm *)0x0,closure);
      gravity_function_free((gravity_vm *)0x0,pgVar2);
    }
    if (closure_01 != (gravity_closure_t *)0x0) {
      pgVar2 = closure_01->f;
      gravity_closure_free((gravity_vm *)0x0,closure_01);
      gravity_function_free((gravity_vm *)0x0,pgVar2);
    }
    if (closure_00->f != (gravity_function_t *)0x0) {
      gravity_function_free((gravity_vm *)0x0,closure_00->f);
    }
    gravity_closure_free((gravity_vm *)0x0,closure_00);
    if (remove_flag) {
      key_00.field_1.p = (gravity_object_t *)&local_78;
      key_00.isa = pgVar3;
      gravity_hash_remove(c->htable,key_00);
    }
    return;
  }
  __assert_fail("closure",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/runtime/gravity_core.c"
                ,0xc90,"void computed_property_free(gravity_class_t *, const char *, _Bool)");
}

Assistant:

void computed_property_free (gravity_class_t *c, const char *name, bool remove_flag) {
    STATICVALUE_FROM_STRING(key, name, strlen(name));
    gravity_closure_t *closure = gravity_class_lookup_closure(c, key);
    assert(closure);

    gravity_closure_t *getter = (gravity_closure_t *)closure->f->special[0];
    gravity_closure_t *setter = (closure->f->special[0] != closure->f->special[1]) ? (gravity_closure_t *)closure->f->special[1] : NULL;
    if (getter) {
        gravity_function_t *f = getter->f;
        gravity_closure_free(NULL, getter);
        gravity_function_free(NULL, f);
    }
    if (setter) {
        gravity_function_t *f = setter->f;
        gravity_closure_free(NULL, setter);
        gravity_function_free(NULL, f);
    }

    if (closure->f) gravity_function_free(NULL, closure->f);
    gravity_closure_free(NULL, closure);

    if (remove_flag) gravity_hash_remove(c->htable, key);
}